

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract
               (defV *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  string_view val_00;
  uint uVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  NamedPoint *point;
  size_t ii;
  vector<double,_std::allocator<double>_> *vec;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_00000260;
  string_view in_stack_00000268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff38;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff40;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this;
  size_type in_stack_ffffffffffffff48;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff60;
  complex<double> local_90;
  __sv_type local_80;
  NamedPoint *local_58;
  undefined8 local_50;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  undefined1 in_stack_ffffffffffffffc8 [16];
  
  pcVar2 = (char *)0x0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  pcVar2 = std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,pcVar2,__c);
  switch(pcVar2) {
  case (char *)0x0:
    std::
    get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2f87a6);
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double_const&,double>
              (in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38,
               (double *)in_stack_ffffffffffffff30);
    break;
  case (char *)0x1:
    std::
    get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2f87e6);
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              (in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38,
               (double *)in_stack_ffffffffffffff30);
    break;
  case (char *)0x2:
  default:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2f882e);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
    helicsGetComplexVector(in_stack_00000268,in_stack_00000260);
    break;
  case (char *)0x3:
    std::
    get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2f8882);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    break;
  case (char *)0x4:
    local_40 = std::
               get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)0x2f88a1);
    std::vector<double,_std::allocator<double>_>::size(local_40);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::clear
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x2f88e1);
    local_48 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0;
    while (this = local_48, sVar3 = std::vector<double,_std::allocator<double>_>::size(local_40),
          this < (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)(sVar3 - 1)
          ) {
      in_stack_ffffffffffffff30 = in_RSI;
      in_stack_ffffffffffffff38 =
           (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
           std::vector<double,_std::allocator<double>_>::operator[](local_40,(size_type)local_48);
      std::vector<double,_std::allocator<double>_>::operator[]
                (local_40,(size_type)
                          ((long)&(local_48->
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                (this,(double *)in_stack_ffffffffffffff38,(double *)in_stack_ffffffffffffff30);
      local_48 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 ((long)&(local_48->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 2);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_40);
    if ((sVar3 & 1) == 1) {
      std::vector<double,_std::allocator<double>_>::back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
      local_50 = 0;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double>
                (this,(double *)in_stack_ffffffffffffff38,(double *)in_stack_ffffffffffffff30);
    }
    break;
  case (char *)0x5:
    std::
    get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2f89e5);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
              (in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
    break;
  case (char *)0x6:
    local_58 = std::
               get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)0x2f8a07);
    uVar1 = std::isnan(local_58->value);
    if ((uVar1 & 1) == 0) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::complex<double>::complex(&local_90,local_58->value,0.0);
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          in_RSI,0);
      *(undefined8 *)pvVar4->_M_value = local_90._M_value._0_8_;
      *(undefined8 *)(pvVar4->_M_value + 8) = local_90._M_value._8_8_;
    }
    else {
      local_80 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30)
      ;
      val_00._M_str = pcVar2;
      val_00._M_len = (size_t)in_stack_ffffffffffffff60;
      helicsGetComplexVector(val_00);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                (in_stack_ffffffffffffff40);
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.emplace_back(std::get<double>(data), 0.0);
            break;
        case int_loc:  // int64_t
            val.emplace_back(static_cast<double>(std::get<int64_t>(data)), 0.0);
            break;
        case string_loc:  // string
        default:
            helicsGetComplexVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            val.push_back(std::get<std::complex<double>>(data));
        } break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val.reserve(vec.size() + 1 / 2);
            val.clear();
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }
            break;
        }
        case complex_vector_loc:  // complex
            val = std::get<std::vector<std::complex<double>>>(data);
            break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetComplexVector(point.name);
            } else {
                val.resize(1);
                val[0] = std::complex<double>(point.value, 0.0);
            }
            break;
        }
    }
}